

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O2

MPP_RET mpp_packet_append(MppPacket dst,MppPacket src)

{
  MPP_RET MVar1;
  uint uVar2;
  uint uVar3;
  RK_S32 *pRVar4;
  ulong uVar5;
  
  MVar1 = check_is_mpp_packet_f(dst,"mpp_packet_append");
  if ((MVar1 == MPP_OK) && (MVar1 = check_is_mpp_packet_f(src,"mpp_packet_append"), MVar1 == MPP_OK)
     ) {
    memcpy((void *)(*(long *)((long)dst + 0x10) + *(long *)((long)dst + 0x20)),
           *(void **)((long)src + 0x10),*(size_t *)((long)src + 0x20));
    uVar2 = *(uint *)((long)src + 0x58);
    uVar5 = *(ulong *)((long)dst + 0x20);
    if (uVar2 != 0) {
      pRVar4 = (RK_S32 *)(*(long *)((long)src + 0x128) + 0xc);
      for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
        mpp_packet_add_segment_info(dst,pRVar4[-2],(int)uVar5,*pRVar4);
        uVar5 = (ulong)(uint)((int)uVar5 + *pRVar4);
        uVar2 = *(uint *)((long)src + 0x58);
        pRVar4 = pRVar4 + 6;
      }
      uVar5 = *(ulong *)((long)dst + 0x20);
    }
    *(ulong *)((long)dst + 0x20) = uVar5 + *(long *)((long)src + 0x20);
    return MPP_OK;
  }
  _mpp_log_l(2,"mpp_packet","invalid input: dst %p src %p\n","mpp_packet_append",dst,src);
  return MPP_ERR_UNKNOW;
}

Assistant:

MPP_RET mpp_packet_append(MppPacket dst, MppPacket src)
{
    if (check_is_mpp_packet(dst) || check_is_mpp_packet(src)) {
        mpp_err_f("invalid input: dst %p src %p\n", dst, src);
        return MPP_ERR_UNKNOW;
    }

    MppPacketImpl *dst_impl = (MppPacketImpl *)dst;
    MppPacketImpl *src_impl = (MppPacketImpl *)src;

    memcpy((RK_U8 *)dst_impl->pos + dst_impl->length, src_impl->pos,
           src_impl->length);

    if (src_impl->segment_nb) {
        MppPktSeg *segs = src_impl->segments;
        RK_U32 offset = dst_impl->length;
        RK_U32 i;

        for (i = 0; i < src_impl->segment_nb; i++, segs++) {
            mpp_packet_add_segment_info(dst, segs->type, offset, segs->len);
            offset += segs->len;
        }
    }

    dst_impl->length += src_impl->length;
    return MPP_OK;
}